

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.hpp
# Opt level: O0

int32_t __thiscall helics::TimeCoordinator::getCurrentIteration(TimeCoordinator *this)

{
  long in_RDI;
  memory_order __b;
  
  CLI::std::operator&(seq_cst,__memory_order_mask);
  return *(int32_t *)(in_RDI + 0x260);
}

Assistant:

int32_t getCurrentIteration() const { return iteration.load(); }